

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall absl::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  int iVar1;
  pointer pTVar2;
  value_type *__x;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  weekday wVar6;
  diff_t dVar7;
  int_fast64_t iVar8;
  int_fast64_t iVar9;
  value_type *__x_00;
  uint_fast8_t tt1_index;
  long year;
  int jan1_weekday;
  ulong uVar10;
  uint_least8_t dst_ti;
  uint_least8_t std_ti;
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  *local_140;
  TimeZoneInfo *local_138;
  int_fast64_t local_130;
  long local_128;
  PosixTimeZone posix;
  value_type local_a0;
  value_type local_70;
  civil_second jan1;
  
  this->extended_ = false;
  if ((this->future_spec_)._M_string_length == 0) {
    return true;
  }
  posix.std_abbr._M_dataplus._M_p = (pointer)&posix.std_abbr.field_2;
  posix.std_abbr._M_string_length = 0;
  bVar4 = false;
  posix.std_abbr.field_2._M_local_buf[0] = '\0';
  posix.dst_abbr._M_dataplus._M_p = (pointer)&posix.dst_abbr.field_2;
  posix.dst_abbr._M_string_length = 0;
  posix.dst_abbr.field_2._M_local_buf[0] = '\0';
  bVar3 = ParsePosixSpec(&this->future_spec_,&posix);
  if (bVar3) {
    bVar4 = false;
    bVar3 = GetTransitionType(this,posix.std_offset,false,&posix.std_abbr,&std_ti);
    if (bVar3) {
      if (posix.dst_abbr._M_string_length == 0) {
        tt1_index = (this->transitions_).
                    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
        dst_ti = std_ti;
      }
      else {
        bVar3 = GetTransitionType(this,posix.dst_offset,true,&posix.dst_abbr,&dst_ti);
        if (!bVar3) {
          bVar4 = false;
          goto LAB_0013d1bf;
        }
        if ((((posix.dst_start.date.fmt != N) ||
             (posix.dst_start.date.field_1 != (anon_union_8_3_4e90bb4b_for_Date_1)0x0)) ||
            (posix.dst_start.time.offset != 0)) ||
           (((posix.dst_end.date.fmt != J ||
             (posix.dst_end.date.field_1 != (anon_union_8_3_4e90bb4b_for_Date_1)0x16d)) ||
            ((posix.std_offset - posix.dst_offset) + posix.dst_end.time.offset != 0x15180)))) {
          local_140 = &this->transitions_;
          std::
          vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
          ::reserve(local_140,
                    ((long)(this->transitions_).
                           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->transitions_).
                          super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30 + 0x324);
          this->extended_ = true;
          pTVar2 = (this->transitions_).
                   super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_130 = pTVar2[-1].unix_time;
          LocalTime((absolute_lookup *)&local_70,this,local_130,
                    (this->transition_types_).
                    super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                    ._M_impl.super__Vector_impl_data._M_start + pTVar2[-1].type_index);
          this->last_year_ = local_70.unix_time;
          bVar3 = anon_unknown_0::IsLeap(local_70.unix_time);
          uVar5 = (uint)bVar3;
          jan1.f_.y = local_70.unix_time;
          jan1.f_._12_4_ = jan1.f_._12_4_ & 0xffffff00;
          jan1.f_.m = '\x01';
          jan1.f_.d = '\x01';
          jan1.f_.hh = '\0';
          jan1.f_.mm = '\0';
          dVar7 = detail::difference((detail *)local_70.unix_time,CONCAT44(jan1.f_._12_4_,0x101),
                                     0x7b2,0x101);
          wVar6 = detail::get_weekday(&jan1);
          uVar10 = (ulong)(wVar6 + tuesday);
          if (saturday < wVar6) {
            uVar10 = 0;
          }
          local_70.unix_time = 0;
          local_70.type_index = dst_ti;
          local_70.civil_sec.f_.y = 0x7b2;
          local_70.civil_sec.f_.m = '\x01';
          local_70.civil_sec.f_.d = '\x01';
          local_70.civil_sec.f_.hh = '\0';
          local_70.civil_sec.f_.mm = '\0';
          local_70.civil_sec.f_.ss = '\0';
          local_70.prev_civil_sec.f_.y = 0x7b2;
          local_70.prev_civil_sec.f_.m = '\x01';
          local_70.prev_civil_sec.f_.d = '\x01';
          local_70.prev_civil_sec.f_.hh = '\0';
          local_70.prev_civil_sec.f_.mm = '\0';
          local_70.prev_civil_sec.f_.ss = '\0';
          local_a0.type_index = std_ti;
          local_a0.civil_sec.f_.y = 0x7b2;
          local_a0.civil_sec.f_.m = '\x01';
          local_a0.civil_sec.f_.d = '\x01';
          local_a0.civil_sec.f_.hh = '\0';
          local_a0.civil_sec.f_.mm = '\0';
          local_a0.civil_sec.f_.ss = '\0';
          local_a0.prev_civil_sec.f_.y = 0x7b2;
          local_a0.prev_civil_sec.f_.m = '\x01';
          local_a0.prev_civil_sec.f_.d = '\x01';
          local_a0.prev_civil_sec.f_.hh = '\0';
          local_a0.prev_civil_sec.f_.mm = '\0';
          local_a0.prev_civil_sec.f_.ss = '\0';
          year = this->last_year_;
          local_128 = year + 0x191;
          local_138 = this;
          while( true ) {
            jan1_weekday = (int)uVar10;
            iVar8 = anon_unknown_0::TransOffset(SUB41(uVar5,0),jan1_weekday,&posix.dst_start);
            iVar9 = anon_unknown_0::TransOffset(SUB41(uVar5,0),jan1_weekday,&posix.dst_end);
            local_70.unix_time = (iVar8 + dVar7) - posix.std_offset;
            local_a0.unix_time = (iVar9 + dVar7) - posix.dst_offset;
            __x_00 = &local_70;
            __x = &local_a0;
            if (local_70.unix_time < local_a0.unix_time) {
              __x_00 = &local_a0;
              __x = &local_70;
            }
            if (local_130 < __x_00->unix_time) {
              if (local_130 < __x->unix_time) {
                std::
                vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                ::push_back(local_140,__x);
              }
              std::
              vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
              ::push_back(local_140,__x_00);
              year = local_138->last_year_;
            }
            if (year == local_128) break;
            iVar1 = *(int *)((long)&(anonymous_namespace)::kSecsPerYear + (ulong)(uVar5 * 4));
            year = year + 1;
            uVar10 = (long)(jan1_weekday +
                           *(int *)((long)&(anonymous_namespace)::kDaysPerYear + (ulong)(uVar5 * 4))
                           ) % 7 & 0xffffffff;
            if (uVar5 == 0) {
              bVar3 = anon_unknown_0::IsLeap(year);
              uVar5 = (uint)bVar3;
            }
            else {
              uVar5 = 0;
            }
            dVar7 = dVar7 + iVar1;
            local_138->last_year_ = year;
          }
          bVar4 = true;
          goto LAB_0013d1bf;
        }
        tt1_index = (this->transitions_).
                    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
      }
      bVar4 = EquivTransitions(this,tt1_index,dst_ti);
    }
  }
LAB_0013d1bf:
  PosixTimeZone::~PosixTimeZone(&posix);
  return bVar4;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  if (AllYearDST(posix)) {  // dst only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, dst_ti);
  }

  // Extend the transitions for an additional 401 years using the future
  // specification. Years beyond those can be handled by mapping back to
  // a cycle-equivalent year within that range. Note that we need 401
  // (well, at least the first transition in the 401st year) so that the
  // end of the 400th year is mapped back to an extended year. And first
  // we may also need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 2 + 401 * 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 401;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}